

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::start(socks5 *this,proxy_settings *ps)

{
  resolver_interface *prVar1;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  _Function_base local_60;
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  local_40;
  
  proxy_settings::operator=(&this->m_proxy_settings,ps);
  (this->m_proxy_addr).impl_.data_.v4.sin_port = ps->port << 8 | ps->port >> 8;
  prVar1 = this->m_resolver;
  ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::socks5,void>
            ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_40._M_f = (offset_in_socks5_to_subr)on_name_lookup;
  local_40._8_8_ = 0;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_70[0]._M_pi;
  local_78 = (element_type *)0x0;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
  ::
  function<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,void>
            ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
              *)&local_60,&local_40);
  (**prVar1->_vptr_resolver_interface)(prVar1,ps,2,&local_60);
  ::std::_Function_base::~_Function_base(&local_60);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
              super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  return;
}

Assistant:

void socks5::start(aux::proxy_settings const& ps)
{
	m_proxy_settings = ps;

	ADD_OUTSTANDING_ASYNC("socks5::on_name_lookup");
	m_proxy_addr.port(ps.port);
	m_resolver.async_resolve(ps.hostname, aux::resolver_interface::abort_on_shutdown
		, std::bind(&socks5::on_name_lookup, self(), _1, _2));
}